

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O1

int test_layer<ncnn::Dropout>
              (int typeindex,ParamDict *pd,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *weights,
              Option *_opt,Mat *a,Mat *top_shape,float epsilon,_func_void_Dropout_ptr *func)

{
  pointer pMVar1;
  int *piVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  int iVar10;
  undefined8 uVar11;
  int iVar12;
  Dropout *this;
  undefined4 uVar13;
  Option *pOVar14;
  Mat *__arg;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *this_00;
  long lVar15;
  ulong uVar16;
  Mat a_bf16;
  Option opt;
  ModelBinFromMatArray mb;
  Mat local_1c8;
  void *local_188 [2];
  Mat local_178;
  undefined1 local_138 [32];
  undefined1 local_118 [16];
  undefined1 auStack_108 [16];
  float local_ec;
  Option local_e8;
  int local_9c;
  undefined1 local_98 [32];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  ParamDict *local_50;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_48;
  ModelBinFromMatArray local_40;
  
  pOVar14 = _opt;
  __arg = a;
  local_ec = epsilon;
  local_9c = typeindex;
  local_50 = pd;
  local_48 = weights;
  this = (Dropout *)ncnn::create_layer(typeindex);
  iVar12 = (int)pOVar14;
  local_e8.use_int8_arithmetic = _opt->use_int8_arithmetic;
  local_e8.use_packing_layout = _opt->use_packing_layout;
  local_e8.use_shader_pack8 = _opt->use_shader_pack8;
  local_e8.use_bf16_storage = _opt->use_bf16_storage;
  local_e8._36_4_ = *(undefined4 *)&_opt->field_0x24;
  local_e8.lightmode = _opt->lightmode;
  local_e8._1_3_ = *(undefined3 *)&_opt->field_0x1;
  local_e8.num_threads = _opt->num_threads;
  local_e8.blob_allocator = _opt->blob_allocator;
  local_e8.workspace_allocator = _opt->workspace_allocator;
  local_e8.use_winograd_convolution = _opt->use_winograd_convolution;
  local_e8.use_sgemm_convolution = _opt->use_sgemm_convolution;
  local_e8.use_int8_inference = _opt->use_int8_inference;
  local_e8.use_vulkan_compute = _opt->use_vulkan_compute;
  local_e8.use_fp16_packed = _opt->use_fp16_packed;
  local_e8.use_fp16_storage = _opt->use_fp16_storage;
  local_e8.use_fp16_arithmetic = _opt->use_fp16_arithmetic;
  local_e8.use_int8_storage = _opt->use_int8_storage;
  if (func != (_func_void_Dropout_ptr *)0x0) {
    (*func)(this);
  }
  if ((this->super_Layer).support_vulkan == false) {
    local_e8.use_vulkan_compute = false;
  }
  if ((this->super_Layer).support_packing == false) {
    local_e8.use_packing_layout = false;
  }
  if ((this->super_Layer).support_bf16_storage == false) {
    local_e8.use_bf16_storage = false;
  }
  uVar11 = local_e8._32_8_;
  if (local_e8.use_int8_inference == true) {
    local_e8.use_bf16_storage = false;
    local_e8.use_int8_arithmetic = SUB81(uVar11,0);
    local_e8.use_packing_layout = false;
  }
  if (top_shape->dims != 0) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(&(this->super_Layer).bottom_shapes,1)
    ;
    this_00 = &(this->super_Layer).top_shapes;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(this_00,1);
    pMVar1 = (this->super_Layer).bottom_shapes.
             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pMVar1 != a) {
      piVar2 = a->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = pMVar1->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (pMVar1->allocator == (Allocator *)0x0) {
            if (pMVar1->data != (void *)0x0) {
              free(pMVar1->data);
            }
          }
          else {
            (**(code **)(*(long *)pMVar1->allocator + 0x18))();
          }
        }
      }
      *(undefined1 (*) [16])((long)&pMVar1->refcount + 4) = (undefined1  [16])0x0;
      pMVar1->data = (void *)0x0;
      pMVar1->refcount = (int *)0x0;
      pMVar1->dims = 0;
      pMVar1->w = 0;
      pMVar1->h = 0;
      pMVar1->c = 0;
      pMVar1->cstep = 0;
      piVar2 = a->refcount;
      pMVar1->data = a->data;
      pMVar1->refcount = piVar2;
      pMVar1->elemsize = a->elemsize;
      pMVar1->elempack = a->elempack;
      pMVar1->allocator = a->allocator;
      iVar8 = a->w;
      iVar9 = a->h;
      iVar10 = a->c;
      pMVar1->dims = a->dims;
      pMVar1->w = iVar8;
      pMVar1->h = iVar9;
      pMVar1->c = iVar10;
      pMVar1->cstep = a->cstep;
    }
    pMVar1 = (this_00->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (pMVar1 != top_shape) {
      piVar2 = top_shape->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = pMVar1->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (pMVar1->allocator == (Allocator *)0x0) {
            if (pMVar1->data != (void *)0x0) {
              free(pMVar1->data);
            }
          }
          else {
            (**(code **)(*(long *)pMVar1->allocator + 0x18))();
          }
        }
      }
      *(undefined1 (*) [16])((long)&pMVar1->refcount + 4) = (undefined1  [16])0x0;
      pMVar1->data = (void *)0x0;
      pMVar1->refcount = (int *)0x0;
      pMVar1->dims = 0;
      pMVar1->w = 0;
      pMVar1->h = 0;
      pMVar1->c = 0;
      pMVar1->cstep = 0;
      piVar2 = top_shape->refcount;
      pMVar1->data = top_shape->data;
      pMVar1->refcount = piVar2;
      pMVar1->elemsize = top_shape->elemsize;
      pMVar1->elempack = top_shape->elempack;
      pMVar1->allocator = top_shape->allocator;
      iVar8 = top_shape->w;
      iVar9 = top_shape->h;
      iVar10 = top_shape->c;
      pMVar1->dims = top_shape->dims;
      pMVar1->w = iVar8;
      pMVar1->h = iVar9;
      pMVar1->c = iVar10;
      pMVar1->cstep = top_shape->cstep;
    }
  }
  (*(this->super_Layer)._vptr_Layer[2])(this,local_50);
  ncnn::ModelBinFromMatArray::ModelBinFromMatArray
            (&local_40,
             (local_48->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start);
  (*(this->super_Layer)._vptr_Layer[3])(this,&local_40);
  (*(this->super_Layer)._vptr_Layer[4])(this,&local_e8);
  local_98._16_4_ = 0;
  local_98._20_4_ = 0;
  local_98._24_4_ = 0;
  local_98._0_8_ = (void *)0x0;
  local_98._8_4_ = 0;
  local_98._12_4_ = 0;
  local_78 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  if ((this->super_Layer).support_inplace == true) {
    ncnn::Mat::clone((Mat *)local_138,(__fn *)a,(void *)0x0,iVar12,__arg);
    piVar2 = (int *)CONCAT44(local_138._12_4_,local_138._8_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if ((Allocator *)local_78._0_8_ == (Allocator *)0x0) {
          if ((void *)local_98._0_8_ != (void *)0x0) {
            free((void *)local_98._0_8_);
          }
        }
        else {
          (**(code **)(*(long *)local_78._0_8_ + 0x18))();
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_138._12_4_,local_138._8_4_);
    local_98._0_8_ = local_138._0_8_;
    local_98._8_4_ = local_138._8_4_;
    local_98._12_4_ = local_138._12_4_;
    local_98._16_4_ = local_138._16_4_;
    local_98._20_4_ = local_138._20_4_;
    local_98._24_4_ = local_138._24_4_;
    local_78 = local_118;
    local_68 = auStack_108;
    uVar13 = auStack_108._8_4_;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if ((Allocator *)local_118._0_8_ == (Allocator *)0x0) {
          if ((void *)local_138._0_8_ != (void *)0x0) {
            free((void *)local_138._0_8_);
          }
        }
        else {
          (**(code **)(*(long *)local_118._0_8_ + 0x18))();
          uVar13 = auStack_108._8_4_;
        }
      }
    }
    local_138._16_4_ = 0;
    local_138._20_4_ = 0;
    local_138._24_4_ = 0;
    local_138._0_8_ = (void *)0x0;
    local_138._8_4_ = 0;
    local_138._12_4_ = 0;
    local_118._8_8_ = 0;
    auStack_108 = ZEXT816(0);
    ncnn::Dropout::forward_inplace(this,(Mat *)local_98,&local_e8);
  }
  else {
    pOVar14 = &local_e8;
    ncnn::Layer::forward((Layer *)this,a,(Mat *)local_98,pOVar14);
    uVar13 = SUB84(pOVar14,0);
  }
  local_138._16_4_ = 0;
  local_138._20_4_ = 0;
  local_138._24_4_ = 0;
  local_138._0_8_ = (void *)0x0;
  local_138._8_4_ = 0;
  local_138._12_4_ = 0;
  local_118 = (undefined1  [16])0x0;
  auStack_108 = (undefined1  [16])0x0;
  local_178.elemsize._0_4_ = 0;
  local_178.elemsize._4_4_ = 0;
  local_178.elempack = 0;
  local_178.data = (void *)0x0;
  local_178.refcount._0_4_ = 0;
  local_178.refcount._4_4_ = 0;
  local_178.allocator = (Allocator *)0x0;
  local_178.dims = 0;
  local_178.w = 0;
  local_178.h = 0;
  local_178.c = 0;
  local_178.cstep = 0;
  if (local_e8.use_packing_layout == true) {
    pOVar14 = &local_e8;
    ncnn::convert_packing(a,&local_178,4,pOVar14);
    uVar13 = SUB84(pOVar14,0);
  }
  else if (&local_178 != a) {
    piVar2 = a->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    auStack_108 = (undefined1  [16])0x0;
    local_118 = (undefined1  [16])0x0;
    local_138._24_4_ = 0;
    local_138._20_4_ = 0;
    local_138._16_4_ = 0;
    local_138._12_4_ = 0;
    local_138._8_4_ = 0;
    local_138._0_8_ = (void *)0x0;
    local_178.data = a->data;
    local_178.refcount._0_4_ = SUB84(a->refcount,0);
    local_178.refcount._4_4_ = (undefined4)((ulong)a->refcount >> 0x20);
    local_178.elemsize._0_4_ = (undefined4)a->elemsize;
    local_178.elemsize._4_4_ = (undefined4)(a->elemsize >> 0x20);
    local_178.elempack = a->elempack;
    local_178.allocator = a->allocator;
    uVar3 = a->dims;
    uVar4 = a->w;
    uVar5 = a->h;
    uVar6 = a->c;
    local_178.cstep = a->cstep;
    local_178.dims = uVar3;
    local_178.w = uVar4;
    local_178.h = uVar5;
    local_178.c = uVar6;
  }
  if (local_e8.use_bf16_storage == true) {
    local_1c8.elemsize._0_4_ = 0;
    local_1c8.elemsize._4_4_ = 0;
    local_1c8.elempack = 0;
    local_1c8.data = (void *)0x0;
    local_1c8.refcount._0_4_ = 0;
    local_1c8.refcount._4_4_ = 0;
    local_1c8.allocator = (Allocator *)0x0;
    local_1c8.dims = 0;
    local_1c8.w = 0;
    local_1c8.h = 0;
    local_1c8.c = 0;
    local_1c8.cstep = 0;
    ncnn::cast_float32_to_bfloat16(&local_178,&local_1c8,&local_e8);
    piVar2 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_178.allocator == (Allocator *)0x0) {
          if (local_178.data != (void *)0x0) {
            free(local_178.data);
          }
        }
        else {
          (**(code **)(*(long *)local_178.allocator + 0x18))();
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
    local_178.data = local_1c8.data;
    local_178.refcount._0_4_ = local_1c8.refcount._0_4_;
    local_178.refcount._4_4_ = local_1c8.refcount._4_4_;
    local_178.elemsize._0_4_ = (undefined4)local_1c8.elemsize;
    local_178.elemsize._4_4_ = local_1c8.elemsize._4_4_;
    local_178.elempack = local_1c8.elempack;
    local_178.allocator = local_1c8.allocator;
    local_178.dims = local_1c8.dims;
    local_178.w = local_1c8.w;
    local_178.h = local_1c8.h;
    local_178.c = local_1c8.c;
    local_178.cstep = local_1c8.cstep;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_1c8.allocator == (Allocator *)0x0) {
          if (local_1c8.data != (void *)0x0) {
            free(local_1c8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_1c8.allocator + 0x18))();
        }
      }
    }
    uVar13 = (undefined4)local_1c8.cstep;
    local_1c8.elemsize._0_4_ = 0;
    local_1c8.elemsize._4_4_ = 0;
    local_1c8.elempack = 0;
    local_1c8.data = (void *)0x0;
    local_1c8.refcount._0_4_ = 0;
    local_1c8.refcount._4_4_ = 0;
    local_1c8.dims = 0;
    local_1c8.w = 0;
    local_1c8.h = 0;
    local_1c8.c = 0;
    local_1c8.cstep = 0;
  }
  if ((this->super_Layer).support_inplace != true) {
    (*(this->super_Layer)._vptr_Layer[7])(this,&local_178,local_138,&local_e8);
    goto LAB_00115b1f;
  }
  if ((local_178.data == (void *)0x0) || (local_178.cstep * (long)local_178.c == 0)) {
    local_1c8.elemsize._0_4_ = 0;
    local_1c8.elemsize._4_4_ = 0;
    local_1c8.elempack = 0;
    local_1c8.data = (void *)0x0;
    local_1c8.refcount = (int *)0x0;
    local_1c8.allocator = (Allocator *)0x0;
    local_1c8.dims = 0;
    local_1c8.w = 0;
    local_1c8.h = 0;
    local_1c8.c = 0;
    local_1c8.cstep = 0;
  }
  else {
    local_1c8.elemsize._0_4_ = 0;
    local_1c8.elemsize._4_4_ = 0;
    local_1c8.elempack = 0;
    local_1c8.data = (void *)0x0;
    local_1c8.refcount = (int *)0x0;
    local_1c8.allocator = (Allocator *)0x0;
    local_1c8.dims = 0;
    local_1c8.w = 0;
    local_1c8.h = 0;
    local_1c8.c = 0;
    local_1c8.cstep = 0;
    if (local_178.dims == 3) {
      uVar16 = CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize);
      auVar7._4_4_ = -(uint)(local_178.h == 0);
      auVar7._0_4_ = -(uint)(local_178.w == 0);
      auVar7._8_4_ = -(uint)(local_178.c == 0);
      auVar7._12_4_ = 0;
      iVar12 = movmskps(uVar13,auVar7 << 0x20);
      if (((iVar12 != 0xf) || (local_178.elempack != 0)) || (uVar16 != 0)) {
        local_1c8.elempack = local_178.elempack;
        local_1c8.data = (void *)0x0;
        local_1c8.refcount = (int *)0x0;
        local_1c8.elemsize._0_4_ = (undefined4)local_178.elemsize;
        local_1c8.elemsize._4_4_ = local_178.elemsize._4_4_;
        local_1c8.allocator = (Allocator *)0x0;
        local_1c8.dims = 3;
        local_1c8.w = local_178.w;
        local_1c8.h = local_178.h;
        local_1c8.c = local_178.c;
        local_1c8.cstep =
             ((long)(local_178.h * local_178.w) * uVar16 + 0xf & 0xfffffffffffffff0) / uVar16;
        lVar15 = (long)local_178.c * local_1c8.cstep;
        if (lVar15 != 0) {
          lVar15 = lVar15 * uVar16;
          goto LAB_00115990;
        }
      }
    }
    else {
      if (local_178.dims == 2) {
        local_1c8.dims = 2;
        local_1c8.h = local_178.h;
        iVar12 = local_178.h * local_178.w;
      }
      else {
        local_1c8.refcount = (int *)0x0;
        if (local_178.dims != 1) goto LAB_001159d8;
        local_1c8.dims = 1;
        local_1c8.h = 1;
        iVar12 = local_178.w;
      }
      local_1c8.elempack = local_178.elempack;
      local_1c8.c = 1;
      local_1c8.w = local_178.w;
      local_1c8.allocator = (Allocator *)0x0;
      local_1c8.elemsize._4_4_ = local_178.elemsize._4_4_;
      local_1c8.elemsize._0_4_ = (undefined4)local_178.elemsize;
      local_1c8.refcount = (int *)0x0;
      local_1c8.data = (void *)0x0;
      local_1c8.cstep = (size_t)iVar12;
      if (iVar12 != 0) {
        lVar15 = CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize) * local_1c8.cstep
        ;
LAB_00115990:
        local_1c8.w = local_178.w;
        local_1c8.elempack = local_178.elempack;
        local_1c8.refcount._4_4_ = 0;
        local_1c8.refcount._0_4_ = 0;
        local_1c8.data = (void *)0x0;
        local_1c8.allocator = (Allocator *)0x0;
        local_1c8.elemsize._4_4_ = local_178.elemsize._4_4_;
        local_1c8.elemsize._0_4_ = (undefined4)local_178.elemsize;
        uVar16 = lVar15 + 3U & 0xfffffffffffffffc;
        local_188[0] = (void *)0x0;
        iVar12 = posix_memalign(local_188,0x10,uVar16 + 4);
        if (iVar12 != 0) {
          local_188[0] = (void *)0x0;
        }
        local_1c8.data = local_188[0];
        local_1c8.refcount = (int *)(uVar16 + (long)local_188[0]);
        *local_1c8.refcount = 1;
      }
    }
LAB_001159d8:
    if ((long)local_178.c * local_178.cstep != 0) {
      memcpy(local_1c8.data,local_178.data,
             (long)local_178.c * local_178.cstep *
             CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize));
    }
  }
  if (local_1c8.refcount != (int *)0x0) {
    LOCK();
    *local_1c8.refcount = *local_1c8.refcount + 1;
    UNLOCK();
  }
  piVar2 = (int *)CONCAT44(local_138._12_4_,local_138._8_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if ((Allocator *)local_118._0_8_ == (Allocator *)0x0) {
        if ((void *)local_138._0_8_ != (void *)0x0) {
          free((void *)local_138._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)local_118._0_8_ + 0x18))();
      }
    }
  }
  local_138._0_8_ = local_1c8.data;
  local_138._16_4_ = (undefined4)local_1c8.elemsize;
  local_138._20_4_ = local_1c8.elemsize._4_4_;
  local_138._24_4_ = local_1c8.elempack;
  local_118._12_4_ = local_1c8.w;
  local_118._8_4_ = local_1c8.dims;
  auStack_108._4_4_ = local_1c8.c;
  auStack_108._0_4_ = local_1c8.h;
  local_118._0_8_ = local_1c8.allocator;
  auStack_108._8_8_ = local_1c8.cstep;
  local_138._8_8_ = local_1c8.refcount;
  if (local_1c8.refcount != (int *)0x0) {
    LOCK();
    *local_1c8.refcount = *local_1c8.refcount + -1;
    UNLOCK();
    if (*local_1c8.refcount == 0) {
      if (local_1c8.allocator == (Allocator *)0x0) {
        if (local_1c8.data != (void *)0x0) {
          free(local_1c8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_1c8.allocator + 0x18))();
        local_138._8_8_ = local_138._8_8_;
      }
    }
  }
  local_1c8.elemsize._0_4_ = 0;
  local_1c8.elemsize._4_4_ = 0;
  local_1c8.elempack = 0;
  local_1c8.data = (void *)0x0;
  local_1c8.refcount._0_4_ = 0;
  local_1c8.refcount._4_4_ = 0;
  local_1c8.dims = 0;
  local_1c8.w = 0;
  local_1c8.h = 0;
  local_1c8.c = 0;
  local_1c8.cstep = 0;
  (*(this->super_Layer)._vptr_Layer[9])(this,local_138,&local_e8);
LAB_00115b1f:
  if (local_e8.use_bf16_storage == true) {
    local_1c8.elemsize._0_4_ = 0;
    local_1c8.elemsize._4_4_ = 0;
    local_1c8.elempack = 0;
    local_1c8.data = (void *)0x0;
    local_1c8.refcount._0_4_ = 0;
    local_1c8.refcount._4_4_ = 0;
    local_1c8.allocator = (Allocator *)0x0;
    local_1c8.dims = 0;
    local_1c8.w = 0;
    local_1c8.h = 0;
    local_1c8.c = 0;
    local_1c8.cstep = 0;
    ncnn::cast_bfloat16_to_float32((Mat *)local_138,&local_1c8,&local_e8);
    piVar2 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    if ((int *)local_138._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_138._8_8_ = *(int *)local_138._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_138._8_8_ == 0) {
        if ((Allocator *)local_118._0_8_ == (Allocator *)0x0) {
          if ((void *)local_138._0_8_ != (void *)0x0) {
            free((void *)local_138._0_8_);
          }
        }
        else {
          (**(code **)(*(long *)local_118._0_8_ + 0x18))();
        }
      }
    }
    piVar2 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
    local_138._0_8_ = local_1c8.data;
    local_138._8_4_ = local_1c8.refcount._0_4_;
    local_138._12_4_ = local_1c8.refcount._4_4_;
    local_138._16_4_ = (undefined4)local_1c8.elemsize;
    local_138._20_4_ = local_1c8.elemsize._4_4_;
    local_138._24_4_ = local_1c8.elempack;
    local_118._12_4_ = local_1c8.w;
    local_118._8_4_ = local_1c8.dims;
    auStack_108._4_4_ = local_1c8.c;
    auStack_108._0_4_ = local_1c8.h;
    local_118._0_8_ = local_1c8.allocator;
    auStack_108._8_8_ = local_1c8.cstep;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_1c8.allocator == (Allocator *)0x0) {
          if (local_1c8.data != (void *)0x0) {
            free(local_1c8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_1c8.allocator + 0x18))();
        }
      }
    }
    local_1c8.elemsize._0_4_ = 0;
    local_1c8.elemsize._4_4_ = 0;
    local_1c8.elempack = 0;
    local_1c8.data = (void *)0x0;
    local_1c8.refcount._0_4_ = 0;
    local_1c8.refcount._4_4_ = 0;
    local_1c8.dims = 0;
    local_1c8.w = 0;
    local_1c8.h = 0;
    local_1c8.c = 0;
    local_1c8.cstep = 0;
  }
  piVar2 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_178.allocator == (Allocator *)0x0) {
        if (local_178.data != (void *)0x0) {
          free(local_178.data);
        }
      }
      else {
        (**(code **)(*(long *)local_178.allocator + 0x18))();
      }
    }
  }
  (*(this->super_Layer)._vptr_Layer[5])(this,&local_e8);
  (*(this->super_Layer)._vptr_Layer[1])(this);
  iVar12 = CompareMat((Mat *)local_98,(Mat *)local_138,local_ec);
  if (iVar12 == 0) {
    iVar12 = 0;
    if (top_shape->dims == 0) {
      iVar12 = test_layer<ncnn::Dropout>
                         (local_9c,local_50,local_48,&local_e8,a,(Mat *)local_98,local_ec,func);
    }
  }
  else {
    test_layer<ncnn::Dropout>();
    iVar12 = -1;
  }
  if ((int *)local_138._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_138._8_8_ = *(int *)local_138._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_138._8_8_ == 0) {
      if ((Allocator *)local_118._0_8_ == (Allocator *)0x0) {
        if ((void *)local_138._0_8_ != (void *)0x0) {
          free((void *)local_138._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)local_118._0_8_ + 0x18))();
      }
    }
  }
  piVar2 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if ((Allocator *)local_78._0_8_ == (Allocator *)0x0) {
        if ((void *)local_98._0_8_ != (void *)0x0) {
          free((void *)local_98._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)local_78._0_8_ + 0x18))();
      }
    }
  }
  ncnn::ModelBin::~ModelBin(&local_40.super_ModelBin);
  return iVar12;
}

Assistant:

int test_layer(int typeindex, const ncnn::ParamDict& pd, const std::vector<ncnn::Mat>& weights, const ncnn::Option& _opt, const ncnn::Mat& a, const ncnn::Mat& top_shape = ncnn::Mat(), float epsilon = 0.001, void (*func)(T*) = 0)
{
    ncnn::Layer* op = ncnn::create_layer(typeindex);
    ncnn::Option opt = _opt;

    if (func)
    {
        (*func)((T*)op);
    }

    if (!op->support_vulkan) opt.use_vulkan_compute = false;
    if (!op->support_packing) opt.use_packing_layout = false;
    if (!op->support_bf16_storage) opt.use_bf16_storage = false;

    if (opt.use_int8_inference) opt.use_bf16_storage = false;
    if (opt.use_int8_inference) opt.use_packing_layout = false;

#if NCNN_VULKAN
    ncnn::VulkanDevice* vkdev = ncnn::get_gpu_device();

    ncnn::VkWeightBufferAllocator g_weight_vkallocator(vkdev);
    ncnn::VkWeightStagingBufferAllocator g_weight_staging_vkallocator(vkdev);

    ncnn::VkAllocator* blob_vkallocator = vkdev->acquire_blob_allocator();
    ncnn::VkAllocator* staging_vkallocator = vkdev->acquire_staging_allocator();

    opt.blob_vkallocator = blob_vkallocator;
    opt.workspace_vkallocator = blob_vkallocator;
    opt.staging_vkallocator = staging_vkallocator;

    if (!vkdev->info.support_fp16_storage) opt.use_fp16_storage = false;
    if (!vkdev->info.support_fp16_packed) opt.use_fp16_packed = false;

    op->vkdev = vkdev;
#endif // NCNN_VULKAN

    if (top_shape.dims)
    {
        op->bottom_shapes.resize(1);
        op->top_shapes.resize(1);
        op->bottom_shapes[0] = a;
        op->top_shapes[0] = top_shape;
    }

    op->load_param(pd);

    ncnn::ModelBinFromMatArray mb(weights.data());

    op->load_model(mb);

    op->create_pipeline(opt);

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        ncnn::VkTransfer cmd(vkdev);

        ncnn::Option opt_upload = opt;
        opt_upload.blob_vkallocator = &g_weight_vkallocator;
        opt_upload.workspace_vkallocator = &g_weight_vkallocator;
        opt_upload.staging_vkallocator = &g_weight_staging_vkallocator;

        op->upload_model(cmd, opt_upload);

        cmd.submit_and_wait();
    }
#endif // NCNN_VULKAN

    ncnn::Mat b;
    if (op->support_inplace)
    {
        b = a.clone();
        ((T*)op)->T::forward_inplace(b, opt);
    }
    else
    {
        ((T*)op)->T::forward(a, b, opt);
    }

    ncnn::Mat c;
    {
        ncnn::Mat a4;
        if (opt.use_packing_layout)
        {
            ncnn::convert_packing(a, a4, 4, opt);
        }
        else
        {
            a4 = a;
        }

        if (opt.use_bf16_storage)
        {
            ncnn::Mat a_bf16;
            ncnn::cast_float32_to_bfloat16(a4, a_bf16, opt);
            a4 = a_bf16;
        }

        if (op->support_inplace)
        {
            c = a4.clone();
            op->forward_inplace(c, opt);
        }
        else
        {
            op->forward(a4, c, opt);
        }

        if (opt.use_bf16_storage)
        {
            ncnn::Mat c_fp32;
            ncnn::cast_bfloat16_to_float32(c, c_fp32, opt);
            c = c_fp32;
        }
    }

#if NCNN_VULKAN
    ncnn::Mat d;
    if (opt.use_vulkan_compute)
    {
        // pack
        ncnn::Mat a4;
        if (opt.use_shader_pack8)
        {
            ncnn::convert_packing(a, a4, 8, opt);
            if (a4.elempack != 8)
                ncnn::convert_packing(a, a4, 4, opt);
        }
        else
            ncnn::convert_packing(a, a4, 4, opt);

        // fp16
        ncnn::Mat a4_fp16;
        if (opt.use_fp16_storage || ((a4.elempack == 4 || a4.elempack == 8) && opt.use_fp16_packed))
        {
            ncnn::cast_float32_to_float16(a4, a4_fp16, opt);
        }
        else
        {
            a4_fp16 = a4;
        }

        // forward
        ncnn::VkCompute cmd(vkdev);

        // upload
        ncnn::VkMat a4_fp16_gpu;
        cmd.record_upload(a4_fp16, a4_fp16_gpu, opt);

        ncnn::VkMat d4_fp16_gpu;
        if (op->support_inplace)
        {
            op->forward_inplace(a4_fp16_gpu, cmd, opt);

            d4_fp16_gpu = a4_fp16_gpu;
        }
        else
        {
            op->forward(a4_fp16_gpu, d4_fp16_gpu, cmd, opt);
        }

        // download
        cmd.record_download(d4_fp16_gpu, d, opt);

        cmd.submit_and_wait();
    }
#endif // NCNN_VULKAN

    op->destroy_pipeline(opt);

    delete op;

#if NCNN_VULKAN
    vkdev->reclaim_blob_allocator(blob_vkallocator);
    vkdev->reclaim_staging_allocator(staging_vkallocator);
    g_weight_vkallocator.clear();
    g_weight_staging_vkallocator.clear();
#endif // NCNN_VULKAN

    if (CompareMat(b, c, epsilon) != 0)
    {
        fprintf(stderr, "test_layer failed cpu\n");
        return -1;
    }

#if NCNN_VULKAN
    if (opt.use_vulkan_compute && CompareMat(b, d, epsilon) != 0)
    {
        fprintf(stderr, "test_layer failed gpu\n");
        return -1;
    }
#endif // NCNN_VULKAN

    if (top_shape.dims == 0)
        return test_layer<T>(typeindex, pd, weights, opt, a, b, epsilon, func);

    return 0;
}